

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O3

double __thiscall NetworkNS::RanMars::rand_gauss(RanMars *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  do {
    dVar1 = uniform(this);
    dVar3 = dVar1 + dVar1 + -1.0;
    dVar1 = uniform(this);
    dVar1 = dVar1 + dVar1 + -1.0;
    dVar1 = dVar3 * dVar3 + dVar1 * dVar1;
  } while (1.0 <= dVar1);
  dVar2 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = log(dVar1);
    dVar1 = (dVar2 * -2.0) / dVar1;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar2 = dVar3 * dVar1;
  }
  return dVar2;
}

Assistant:

double RanMars::rand_gauss(void) {
      double v1, v2, s;

      do {
         v1 = 2.0 * uniform() - 1;
         v2 = 2.0 * uniform() - 1;

         s = v1 * v1 + v2*v2;
      } while (s >= 1.0);

      if (s == 0.0)
         return 0.0;
      else
         return (v1 * sqrt(-2.0 * log(s) / s));
   }